

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall cnn::ComputationGraph::add_input(ComputationGraph *this,real s)

{
  ComputationGraph *in_RSI;
  Node *local_18;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)(in_RSI->nodes).
                           super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(in_RSI->nodes).
                          super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  local_18 = (Node *)operator_new(0x60);
  (local_18->dim).nd = 0;
  (local_18->dim).bd = 1;
  (local_18->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18->_vptr_Node = (_func_int **)&PTR__Node_003914c0;
  *(real *)&local_18[1]._vptr_Node = s;
  local_18[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(local_18 + 1);
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)in_RSI,&local_18);
  set_dim_for_new_node(in_RSI,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_input(real s) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new ScalarInputNode(s));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}